

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlReportText.cpp
# Opt level: O1

string * __thiscall
oout::FmtJunitXml::suite
          (string *__return_storage_ptr__,FmtJunitXml *this,string *name,nanoseconds *duration,
          list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
          *results)

{
  long lVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  ostringstream out;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  CountTest local_1a8 [7];
  ios_base local_138 [264];
  
  CountTest::CountTest(local_1a8,results);
  CountTest::count(local_1a8);
  if (local_1a8[0].result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8[0].result.
               super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  CountFailure::CountFailure((CountFailure *)local_1a8,results);
  CountFailure::count((CountFailure *)local_1a8);
  if (local_1a8[0].result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8[0].result.
               super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  CountError::CountError((CountError *)local_1a8,results);
  CountError::count((CountError *)local_1a8);
  if (local_1a8[0].result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8[0].result.
               super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  lVar1 = duration->__r;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"<testsuite ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"name=\'",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"tests=\'",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"failures=\'",10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"errors=\'",8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"time=\'",6);
  poVar2 = std::ostream::_M_insert<double>((double)((float)lVar1 / 1e+09));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'>",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  p_Var3 = (results->
           super__List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)results) {
    do {
      (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x10))(&local_1c8,p_Var3[1]._M_next,this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      p_Var3 = (((_List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var3 != (_List_node_base *)results);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"</testsuite>",0xc);
  std::ios::widen((char)(ostream *)local_1a8 +
                  (char)local_1a8[0].result.
                        super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        [-3]._vptr_Result);
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string suite(
		const string &name,
		const chrono::nanoseconds &duration,
		const list<shared_ptr<const Result>> &results
	) const override
	{
		const auto count_test = CountTest(results).count();
		const auto count_failure = CountFailure(results).count();
		const auto count_error = CountError(results).count();
		const auto time = chrono::duration_cast<chrono::duration<float>>(duration).count();

		ostringstream out;
		out << "<testsuite "
		    << "name='" << name << "' "
		    << "tests='" << count_test << "' "
		    << "failures='" << count_failure << "' "
		    << "errors='" << count_error << "' "
		    << "time='" << time << "'>"
		    << endl;

		for (const auto &r : results) {
			out << r->print(*this);
		}

		out << "</testsuite>" << endl;
		return out.str();
	}